

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O2

void runtest_maybe_dobin<std::pair<std::vector<float,std::allocator<float>>,std::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>>>,true>
               (string *header,
               pair<std::vector<float,_std::allocator<float>_>,_std::tuple<std::vector<double,_std::allocator<double>_>,_std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::vector<float,_std::allocator<float>_>_>_>
               *arg)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ofstream log_fh;
  
  std::operator+(&local_238,&basedir_abi_cxx11_,"/");
  std::operator+(&local_258,&local_238,header);
  std::operator+(&local_298,&local_258,"-log.txt");
  std::ofstream::ofstream(&log_fh,local_298._M_dataplus._M_p,_S_out);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  poVar1 = std::operator<<((ostream *)&log_fh,"--- ");
  poVar1 = std::operator<<(poVar1,(string *)header);
  poVar1 = std::operator<<(poVar1," -------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&log_fh,"depth=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&log_fh,"ModeAutoDecoder=");
  gnuplotio::Mode1D::class_name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,(string *)&local_298);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_278,(string *)header);
  runtest_inner<std::pair<std::vector<float,std::allocator<float>>,std::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>>>,true>
            ((ostream *)&log_fh,&local_278,arg);
  std::__cxx11::string::~string((string *)&local_278);
  std::ofstream::~ofstream(&log_fh);
  return;
}

Assistant:

void runtest_maybe_dobin(std::string header, const T &arg) {
    std::ofstream log_fh((basedir+"/"+header+"-log.txt").c_str());
    log_fh << "--- " << header << " -------------------------------------" << std::endl;
    log_fh << "depth=" << ArrayTraits<T>::depth << std::endl;
    log_fh << "ModeAutoDecoder=" << ModeAutoDecoder<T>::mode::class_name() << std::endl;
    runtest_inner<T, DoBinary>(log_fh, header, arg);
}